

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_registry.h
# Opt level: O3

Results * __thiscall
testinator::TestRegistry::RunAllTests
          (Results *__return_storage_ptr__,TestRegistry *this,RunParams *params,Outputter *outputter
          )

{
  Outputter *outputter_00;
  TestMap localMap;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>_>_>
  _Stack_58;
  
  _Stack_58._M_impl.super__Rb_tree_header._M_header._M_left =
       &_Stack_58._M_impl.super__Rb_tree_header._M_header;
  _Stack_58._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  _Stack_58._M_impl.super__Rb_tree_header._M_node_count = 0;
  _Stack_58._M_impl.super__Rb_tree_header._M_header._M_right =
       _Stack_58._M_impl.super__Rb_tree_header._M_header._M_left;
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>_>_>
  ::swap(&_Stack_58,
         (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>_>_>
          *)this);
  outputter_00 = outputter;
  if (outputter == (Outputter *)0x0) {
    outputter_00 = (Outputter *)operator_new(8);
    outputter_00->_vptr_Outputter = (_func_int **)&PTR_startRun_0016a718;
  }
  RunTests(__return_storage_ptr__,this,(TestMap *)&_Stack_58,params,outputter_00);
  if (outputter_00 != (Outputter *)0x0 && outputter == (Outputter *)0x0) {
    (*outputter_00->_vptr_Outputter[8])(outputter_00);
  }
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>_>_>
  ::swap((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>_>_>
          *)this,&_Stack_58);
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>_>_>
  ::~_Rb_tree(&_Stack_58);
  return __return_storage_ptr__;
}

Assistant:

Results RunAllTests(const RunParams& params = RunParams(),
                        const Outputter* outputter = nullptr)
    {
      TestMap localMap;
      localMap.swap(m_tests);
      Results rs = RunTests(
          localMap,
          params,
          outputter != nullptr ? outputter : std::make_unique<Outputter>().get());
      m_tests.swap(localMap);
      return rs;
    }